

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

int __thiscall
CVmObjBigNum::getp_log10(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  undefined8 *puVar4;
  long *plVar5;
  size_t in_RDI;
  char *unaff_retaddr;
  char *in_stack_00000008;
  err_frame_t err_cur__;
  char *ln10;
  char *ext3;
  char *ext2;
  char *ext1;
  uint hdl3;
  uint hdl2;
  uint hdl1;
  size_t prec;
  char *new_ext;
  char *in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  vm_val_t *pvVar6;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  uint *in_stack_fffffffffffffec0;
  undefined8 uVar7;
  vm_val_t *in_stack_fffffffffffffec8;
  vm_obj_id_t in_stack_fffffffffffffed4;
  CVmObjBigNum *in_stack_fffffffffffffed8;
  undefined1 local_60 [8];
  undefined1 local_58 [8];
  undefined1 local_50 [12];
  uint local_44;
  uint local_40;
  uint local_3c;
  
  sVar3 = get_prec((char *)0x2b471c);
  iVar1 = setup_getp_0(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,in_stack_fffffffffffffec8
                       ,in_stack_fffffffffffffec0,
                       (char **)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  if (iVar1 == 0) {
    cache_ln10(in_RDI);
    iVar1 = (int)((ulong)&local_44 >> 0x20);
    alloc_temp_regs(sVar3 + 3,3,local_50,&local_3c,local_58,&local_40,local_60);
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    uVar7 = *puVar4;
    plVar5 = (long *)_ZTW11G_err_frame();
    *plVar5 = (long)&stack0xfffffffffffffeb8;
    uVar2 = _setjmp((__jmp_buf_tag *)&stack0xfffffffffffffed0);
    if (uVar2 == 0) {
      compute_ln_into(in_stack_00000008,unaff_retaddr);
      copy_val(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,iVar1);
      compute_quotient_into
                ((char *)err_cur__.jmpbuf_[0].__jmpbuf[5],(char *)err_cur__.jmpbuf_[0].__jmpbuf[4],
                 (char *)err_cur__.jmpbuf_[0].__jmpbuf[3],(char *)err_cur__.jmpbuf_[0].__jmpbuf[2]);
      copy_val(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,iVar1);
    }
    if ((uVar2 & 0x8000) == 0) {
      release_temp_regs(3,(ulong)local_3c,(ulong)local_40,(ulong)local_44);
    }
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    *puVar4 = uVar7;
    if ((uVar2 & 0x4001) != 0) {
      puVar4 = (undefined8 *)_ZTW11G_err_frame();
      pvVar6 = in_stack_fffffffffffffec8;
      if ((*(uint *)*puVar4 & 2) != 0) {
        plVar5 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar5 + 0x10));
        pvVar6 = in_stack_fffffffffffffec8;
      }
      in_stack_fffffffffffffec8 = pvVar6;
      plVar5 = (long *)_ZTW11G_err_frame();
      *(vm_val_t **)(*plVar5 + 0x10) = pvVar6;
      err_rethrow();
    }
    if ((uVar2 & 2) != 0) {
      free(in_stack_fffffffffffffec8);
    }
    CVmStack::discard();
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_log10(VMG_ vm_obj_id_t self,
                             vm_val_t *retval, uint *argc)
{
    char *new_ext;
    size_t prec = get_prec(ext_);
    uint hdl1, hdl2, hdl3;
    char *ext1, *ext2, *ext3;
    const char *ln10;

    /* check arguments and set up the result */
    if (setup_getp_0(vmg_ self, retval, argc, &new_ext))
        return TRUE;

    /* cache ln(10) to the required precision */
    ln10 = cache_ln10(prec + 3);

    /* allocate some temporary registers */
    alloc_temp_regs(prec + 3, 3,
                    &ext1, &hdl1, &ext2, &hdl2, &ext3, &hdl3);

    /* catch errors so we can be sure to free registers */
    err_try
    {
        /* compute the natural logarithm of the number */
        compute_ln_into(ext1, ext_);

        /* get ln(10), properly rounded */
        copy_val(ext2, ln10, TRUE);

        /* compute ln(x)/ln(10) to yield log10(x) */
        compute_quotient_into(ext3, 0, ext1, ext2);

        /* store the result, rounding as needed */
        copy_val(new_ext, ext3, TRUE);
    }